

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O0

Value * __thiscall
soul::Value::fromExternalValue(soul::Type_const&,choc::value::ValueView_const&,soul::
ConstantTable&,soul::StringDictionary&)::ConversionState::convert(soul::Type_const&,choc::value::
ValueView_const__(Value *__return_storage_ptr__,void *this,Type *targetType,ValueView *source)

{
  Type *this_00;
  uint64_t *puVar1;
  long *plVar2;
  ConstantTable *this_01;
  bool bVar3;
  int32_t n;
  uint32_t __val;
  int64_t n_00;
  Handle h;
  ArrayWithPreallocation<soul::Structure::Member,_8UL> *pAVar4;
  ValueView *pVVar5;
  MemberNameAndValue *source_00;
  Member *targetType_00;
  string *args;
  float v;
  double v_00;
  string local_830;
  allocator<char> local_809;
  string_view local_808;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7d8;
  CompileMessage local_7b8;
  CompileMessage local_780;
  int local_744;
  Value local_740;
  SubElementPath local_700;
  undefined1 local_6c8 [8];
  MemberNameAndValue sourceMember;
  uint32_t i_2;
  bool found;
  Member *m;
  uint32_t j;
  undefined1 local_65d;
  uint32_t local_65c;
  Structure *pSStack_658;
  uint32_t numMembers;
  Structure *targetStruct;
  Value local_620;
  SubElementPath local_5e0;
  uint local_5a4;
  uint32_t i_1;
  undefined1 local_588 [8];
  Value result_1;
  Type elementType_1;
  string local_510;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d0;
  CompileMessage local_4b0;
  Value local_478;
  Type local_438;
  undefined1 local_420 [8];
  Value fixedArray;
  Type elementType_2;
  undefined1 local_3c0 [4];
  uint32_t size_1;
  PrimitiveType local_38c;
  Type local_388;
  Value local_370;
  SubElementPath local_330;
  uint local_2f8;
  PrimitiveType local_2f4;
  uint32_t i;
  undefined1 local_2d8 [8];
  Value result;
  PrimitiveType elementType;
  CompileMessage local_270;
  ValueView local_238;
  uint32_t local_208;
  allocator<char> local_201;
  uint32_t size;
  string local_1f0 [32];
  undefined1 local_1d0 [16];
  uint32_t local_1bc;
  Value local_1b8;
  Value local_178;
  Value local_138;
  Value local_f8;
  Value local_b8;
  Value local_68;
  ValueView *local_28;
  ValueView *source_local;
  Type *targetType_local;
  ConversionState *this_local;
  Value *result_2;
  
  local_28 = source;
  source_local = (ValueView *)targetType;
  targetType_local = (Type *)this;
  this_local = (ConversionState *)__return_storage_ptr__;
  bVar3 = choc::value::ValueView::isInt32(source);
  pVVar5 = source_local;
  if (bVar3) {
    n = choc::value::ValueView::getInt32(local_28);
    createInt32<int>(&local_68,n);
    castOrThrow(soul::Type_const&,soul::Value___(__return_storage_ptr__,(Type *)pVVar5,&local_68);
    ~Value(&local_68);
  }
  else {
    bVar3 = choc::value::ValueView::isInt64(local_28);
    pVVar5 = source_local;
    if (bVar3) {
      n_00 = choc::value::ValueView::getInt64(local_28);
      createInt64<long>(&local_b8,n_00);
      castOrThrow(soul::Type_const&,soul::Value___(__return_storage_ptr__,(Type *)pVVar5,&local_b8);
      ~Value(&local_b8);
    }
    else {
      bVar3 = choc::value::ValueView::isFloat32(local_28);
      pVVar5 = source_local;
      if (bVar3) {
        v = choc::value::ValueView::getFloat32(local_28);
        Value::Value(&local_f8,v);
        castOrThrow(soul::Type_const&,soul::Value___
                  (__return_storage_ptr__,(Type *)pVVar5,&local_f8);
        ~Value(&local_f8);
      }
      else {
        bVar3 = choc::value::ValueView::isFloat64(local_28);
        pVVar5 = source_local;
        if (bVar3) {
          v_00 = choc::value::ValueView::getFloat64(local_28);
          Value::Value(&local_138,v_00);
          castOrThrow(soul::Type_const&,soul::Value___
                    (__return_storage_ptr__,(Type *)pVVar5,&local_138);
          ~Value(&local_138);
        }
        else {
          bVar3 = choc::value::ValueView::isBool(local_28);
          pVVar5 = source_local;
          if (bVar3) {
            bVar3 = choc::value::ValueView::getBool(local_28);
            Value::Value(&local_178,bVar3);
            castOrThrow(soul::Type_const&,soul::Value___
                      (__return_storage_ptr__,(Type *)pVVar5,&local_178);
            ~Value(&local_178);
          }
          else {
            bVar3 = choc::value::ValueView::isString(local_28);
            pVVar5 = source_local;
            if (bVar3) {
              plVar2 = *(long **)((long)this + 8);
              _size = choc::value::ValueView::getString(local_28);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                        (local_1f0,(basic_string_view<char,_std::char_traits<char>_> *)&size,
                         &local_201);
              local_1d0 = std::__cxx11::string::operator_cast_to_basic_string_view(local_1f0);
              local_1bc = (**(code **)(*plVar2 + 0x10))(plVar2,local_1d0._0_8_,local_1d0._8_8_);
              createStringLiteral(&local_1b8,(Handle)local_1bc);
              castOrThrow(soul::Type_const&,soul::Value___
                        (__return_storage_ptr__,(Type *)pVVar5,&local_1b8);
              ~Value(&local_1b8);
              std::__cxx11::string::~string(local_1f0);
              std::allocator<char>::~allocator(&local_201);
            }
            else {
              bVar3 = choc::value::ValueView::isVector(local_28);
              if (bVar3) {
                local_208 = choc::value::ValueView::size(local_28);
                if ((local_208 == 1) &&
                   (bVar3 = Type::isPrimitive((Type *)source_local), pVVar5 = source_local, bVar3))
                {
                  choc::value::ValueView::operator[](&local_238,local_28,0);
                  ValueView_const__(__return_storage_ptr__,this,(Type *)pVVar5,&local_238);
                  choc::value::ValueView::~ValueView(&local_238);
                }
                else {
                  bVar3 = Type::isVector((Type *)source_local);
                  if (!bVar3) {
                    Type::getDescription_abi_cxx11_
                              ((string *)&stack0xfffffffffffffd70,(Type *)source_local);
                    Errors::cannotCastBetween<char_const(&)[7],std::__cxx11::string>
                              (&local_270,(Errors *)0x4ae488,(char (*) [7])&stack0xfffffffffffffd70,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               source);
                    throwError(&local_270);
                  }
                  this_00 = (Type *)((long)result.allocatedData.allocatedData.space + 4);
                  Type::getVectorElementType(this_00);
                  PrimitiveType::PrimitiveType(&local_2f4,(PrimitiveType *)this_00);
                  Type::createVector((Type *)&i,&local_2f4,(ulong)local_208);
                  zeroInitialiser((Value *)local_2d8,(Type *)&i);
                  Type::~Type((Type *)&i);
                  for (local_2f8 = 0; local_2f8 < local_208; local_2f8 = local_2f8 + 1) {
                    SubElementPath::SubElementPath(&local_330,(ulong)local_2f8);
                    PrimitiveType::PrimitiveType
                              (&local_38c,
                               (PrimitiveType *)((long)result.allocatedData.allocatedData.space + 4)
                              );
                    Type::Type(&local_388,&local_38c);
                    choc::value::ValueView::operator[]((ValueView *)local_3c0,local_28,local_2f8);
                    ValueView_const__(&local_370,this,&local_388,(ValueView *)local_3c0);
                    modifySubElementInPlace((Value *)local_2d8,&local_330,&local_370);
                    ~Value(&local_370);
                    choc::value::ValueView::~ValueView((ValueView *)local_3c0);
                    Type::~Type(&local_388);
                    SubElementPath::~SubElementPath(&local_330);
                  }
                  castOrThrow(soul::Type_const&,soul::Value___
                            (__return_storage_ptr__,(Type *)source_local,(Value *)local_2d8);
                  ~Value((Value *)local_2d8);
                }
              }
              else {
                bVar3 = choc::value::ValueView::isArray(local_28);
                if (bVar3) {
                  __val = choc::value::ValueView::size(local_28);
                  bVar3 = Type::isUnsizedArray((Type *)source_local);
                  if (bVar3) {
                    puVar1 = fixedArray.allocatedData.allocatedData.space;
                    Type::getElementType((Type *)puVar1,(Type *)source_local);
                    Type::createArray(&local_438,(Type *)puVar1,(ulong)__val);
                    ValueView_const__((Value *)local_420,this,&local_438,local_28);
                    Type::~Type(&local_438);
                    this_01 = *this;
                    Value::Value(&local_478,(Value *)local_420);
                    h = ConstantTable::getHandleForValue(this_01,&local_478);
                    createUnsizedArray(__return_storage_ptr__,
                                       (Type *)fixedArray.allocatedData.allocatedData.space,h);
                    ~Value(&local_478);
                    ~Value((Value *)local_420);
                    Type::~Type((Type *)fixedArray.allocatedData.allocatedData.space);
                  }
                  else {
                    bVar3 = Type::isArray((Type *)source_local);
                    if ((!bVar3) ||
                       (source = (ValueView *)Type::getArraySize((Type *)source_local),
                       (ValueView *)(ulong)__val != source)) {
                      std::__cxx11::to_string(&local_510,__val);
                      std::operator+(&local_4f0,"array[",&local_510);
                      std::operator+(&local_4d0,&local_4f0,"]");
                      Type::getDescription_abi_cxx11_
                                ((string *)&elementType_1.structure,(Type *)source_local);
                      Errors::cannotCastBetween<std::__cxx11::string,std::__cxx11::string>
                                (&local_4b0,(Errors *)&local_4d0,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&elementType_1.structure,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)source);
                      throwError(&local_4b0);
                    }
                    puVar1 = result_1.allocatedData.allocatedData.space;
                    Type::getArrayElementType((Type *)puVar1,(Type *)source_local);
                    Type::createArray((Type *)&stack0xfffffffffffffa60,(Type *)puVar1,(ulong)__val);
                    zeroInitialiser((Value *)local_588,(Type *)&stack0xfffffffffffffa60);
                    Type::~Type((Type *)&stack0xfffffffffffffa60);
                    for (local_5a4 = 0; local_5a4 < __val; local_5a4 = local_5a4 + 1) {
                      SubElementPath::SubElementPath(&local_5e0,(ulong)local_5a4);
                      choc::value::ValueView::operator[]
                                ((ValueView *)&targetStruct,local_28,local_5a4);
                      ValueView_const__(&local_620,this,
                                        (Type *)result_1.allocatedData.allocatedData.space,
                                        (ValueView *)&targetStruct);
                      modifySubElementInPlace((Value *)local_588,&local_5e0,&local_620);
                      ~Value(&local_620);
                      choc::value::ValueView::~ValueView((ValueView *)&targetStruct);
                      SubElementPath::~SubElementPath(&local_5e0);
                    }
                    castOrThrow(soul::Type_const&,soul::Value___
                              (__return_storage_ptr__,(Type *)source_local,(Value *)local_588);
                    ~Value((Value *)local_588);
                    Type::~Type((Type *)result_1.allocatedData.allocatedData.space);
                  }
                }
                else {
                  bVar3 = choc::value::ValueView::isObject(local_28);
                  if (bVar3) {
                    bVar3 = Type::isStruct((Type *)source_local);
                    if (bVar3) {
                      pSStack_658 = Type::getStructRef((Type *)source_local);
                      local_65c = choc::value::ValueView::size(local_28);
                      pAVar4 = Structure::getMembers(pSStack_658);
                      pVVar5 = (ValueView *)
                               ArrayWithPreallocation<soul::Structure::Member,_8UL>::size(pAVar4);
                      source = (ValueView *)(ulong)local_65c;
                      if (pVVar5 == source) {
                        local_65d = 0;
                        Type::Type((Type *)&stack0xfffffffffffff988,(Type *)source_local);
                        zeroInitialiser(__return_storage_ptr__,(Type *)&stack0xfffffffffffff988);
                        Type::~Type((Type *)&stack0xfffffffffffff988);
                        m._4_4_ = 0;
                        do {
                          pAVar4 = Structure::getMembers(pSStack_658);
                          source_00 = (MemberNameAndValue *)
                                      ArrayWithPreallocation<soul::Structure::Member,_8UL>::size
                                                (pAVar4);
                          if (source_00 <= (MemberNameAndValue *)(ulong)m._4_4_) {
                            return __return_storage_ptr__;
                          }
                          pAVar4 = Structure::getMembers(pSStack_658);
                          targetType_00 =
                               ArrayWithPreallocation<soul::Structure::Member,_8UL>::operator[]
                                         (pAVar4,(ulong)m._4_4_);
                          sourceMember.value.stringDictionary._7_1_ = 0;
                          for (sourceMember.value.stringDictionary._0_4_ = 0;
                              (uint)sourceMember.value.stringDictionary < local_65c;
                              sourceMember.value.stringDictionary._0_4_ =
                                   (uint)sourceMember.value.stringDictionary + 1) {
                            choc::value::ValueView::getObjectMemberAt
                                      ((MemberNameAndValue *)local_6c8,local_28,
                                       (uint)sourceMember.value.stringDictionary);
                            bVar3 = std::operator==(&targetType_00->name,(char *)local_6c8);
                            if (bVar3) {
                              SubElementPath::SubElementPath(&local_700,(ulong)m._4_4_);
                              source_00 = &sourceMember;
                              ValueView_const__(&local_740,this,&targetType_00->type,
                                                (ValueView *)source_00);
                              modifySubElementInPlace(__return_storage_ptr__,&local_700,&local_740);
                              ~Value(&local_740);
                              SubElementPath::~SubElementPath(&local_700);
                              sourceMember.value.stringDictionary._7_1_ = 1;
                              local_744 = 0xb;
                            }
                            else {
                              local_744 = 0;
                            }
                            choc::value::MemberNameAndValue::~MemberNameAndValue
                                      ((MemberNameAndValue *)local_6c8);
                            if (local_744 != 0) break;
                          }
                          if ((sourceMember.value.stringDictionary._7_1_ & 1) == 0) {
                            args = Structure::getName_abi_cxx11_(pSStack_658);
                            Errors::
                            unknownMemberInStruct<std::__cxx11::string&,std::__cxx11::string_const&>
                                      (&local_780,(Errors *)&targetType_00->name,args,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)source_00);
                            throwError(&local_780);
                          }
                          m._4_4_ = m._4_4_ + 1;
                        } while( true );
                      }
                    }
                    local_808 = choc::value::ValueView::getObjectClassName(local_28);
                    std::allocator<char>::allocator();
                    std::__cxx11::string::
                    string<std::basic_string_view<char,std::char_traits<char>>,void>
                              ((string *)&local_7f8,&local_808,&local_809);
                    std::operator+(&local_7d8,"struct ",&local_7f8);
                    Type::getDescription_abi_cxx11_(&local_830,(Type *)source_local);
                    Errors::cannotCastBetween<std::__cxx11::string,std::__cxx11::string>
                              (&local_7b8,(Errors *)&local_7d8,&local_830,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               source);
                    throwError(&local_7b8);
                  }
                  Value::Value(__return_storage_ptr__);
                }
              }
            }
          }
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Value convert (const Type& targetType, const choc::value::ValueView& source)
        {
            if (source.isInt32())    return castOrThrow (targetType, Value::createInt32 (source.getInt32()));
            if (source.isInt64())    return castOrThrow (targetType, Value::createInt64 (source.getInt64()));
            if (source.isFloat32())  return castOrThrow (targetType, Value (source.getFloat32()));
            if (source.isFloat64())  return castOrThrow (targetType, Value (source.getFloat64()));
            if (source.isBool())     return castOrThrow (targetType, Value (source.getBool()));
            if (source.isString())   return castOrThrow (targetType, Value::createStringLiteral (dictionary.getHandleForString (std::string (source.getString()))));

            if (source.isVector())
            {
                auto size = source.size();

                if (size == 1 && targetType.isPrimitive())
                    return convert (targetType, source[0]);

                if (! targetType.isVector())
                    throwError (Errors::cannotCastBetween ("vector", targetType.getDescription()));

                auto elementType = targetType.getVectorElementType();
                auto result = Value::zeroInitialiser (Type::createVector (elementType, size));

                for (uint32_t i = 0; i < size; ++i)
                    result.modifySubElementInPlace (i, convert (elementType, source[i]));

                return castOrThrow (targetType, std::move (result));
            }

            if (source.isArray())
            {
                auto size = source.size();

                if (targetType.isUnsizedArray())
                {
                    auto elementType = targetType.getElementType();
                    auto fixedArray = convert (elementType.createArray (size), source);
                    return Value::createUnsizedArray (elementType, constants.getHandleForValue (std::move (fixedArray)));
                }

                if (! (targetType.isArray() && size == targetType.getArraySize()))
                    throwError (Errors::cannotCastBetween ("array[" + std::to_string (size) + "]", targetType.getDescription()));

                auto elementType = targetType.getArrayElementType();
                auto result = Value::zeroInitialiser (elementType.createArray (size));

                for (uint32_t i = 0; i < size; ++i)
                    result.modifySubElementInPlace (i, convert (elementType, source[i]));

                return castOrThrow (targetType, std::move (result));
            }

            if (source.isObject())
            {
                if (targetType.isStruct())
                {
                    auto& targetStruct = targetType.getStructRef();
                    auto numMembers = source.size();

                    if (targetStruct.getMembers().size() == numMembers)
                    {
                        auto result = Value::zeroInitialiser (targetType);

                        for (uint32_t j = 0; j < targetStruct.getMembers().size(); ++j)
                        {
                            auto& m = targetStruct.getMembers()[j];
                            bool found = false;

                            for (uint32_t i = 0; i < numMembers; ++i)
                            {
                                auto sourceMember = source.getObjectMemberAt (i);

                                if (m.name == sourceMember.name)
                                {
                                    result.modifySubElementInPlace (j, convert (m.type, sourceMember.value));
                                    found = true;
                                    break;
                                }
                            }

                            if (! found)
                                throwError (Errors::unknownMemberInStruct (m.name, targetStruct.getName()));
                        }

                        return result;
                    }
                }

                throwError (Errors::cannotCastBetween ("struct " + std::string (source.getObjectClassName()),
                                                       targetType.getDescription()));
            }

            return {};
        }